

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::EndTestCase
          (JunitReporter *this,TestCaseInfo *param_2,Totals *param_3,string *stdOut,string *stdErr)

{
  reference pvVar1;
  ulong uVar2;
  ostream *poVar3;
  string *in_RCX;
  long in_RDI;
  string *in_R8;
  TestCaseStats *testCaseStats;
  vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  *in_stack_ffffffffffffffd0;
  
  std::
  vector<const_Catch::JunitReporter::TestCaseStats_*,_std::allocator<const_Catch::JunitReporter::TestCaseStats_*>_>
  ::pop_back((vector<const_Catch::JunitReporter::TestCaseStats_*,_std::allocator<const_Catch::JunitReporter::TestCaseStats_*>_>
              *)0x186262);
  pvVar1 = std::
           vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
           ::back(in_stack_ffffffffffffffd0);
  std::__cxx11::string::operator=((string *)&pvVar1->m_stdOut,in_RCX);
  std::__cxx11::string::operator=((string *)&pvVar1->m_stdErr,in_R8);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)(in_RDI + 0xb8),in_RCX);
    std::operator<<(poVar3,"\n");
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)(in_RDI + 0x230),in_R8);
    std::operator<<(poVar3,"\n");
  }
  return;
}

Assistant:

virtual void EndTestCase( const Catch::TestCaseInfo&, const Totals&, const std::string& stdOut, const std::string& stdErr ) {
            m_currentTestCaseStats.pop_back();
            assert( m_currentTestCaseStats.empty() );
            TestCaseStats& testCaseStats = m_currentStats->m_testCaseStats.back();
            testCaseStats.m_stdOut = stdOut;
            testCaseStats.m_stdErr = stdErr;
            if( !stdOut.empty() )
                m_stdOut << stdOut << "\n";
            if( !stdErr.empty() )
                m_stdErr << stdErr << "\n";
        }